

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundoview.cpp
# Opt level: O2

int __thiscall QUndoViewPrivate::init(QUndoViewPrivate *this,EVP_PKEY_CTX *ctx)

{
  QObject *parent;
  int iVar1;
  QUndoModel *this_00;
  
  parent = *(QObject **)
            &(this->super_QListViewPrivate).super_QAbstractItemViewPrivate.
             super_QAbstractScrollAreaPrivate.super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  this_00 = (QUndoModel *)operator_new(0x40);
  QUndoModel::QUndoModel(this_00,parent);
  this->model = this_00;
  (**(code **)(*(long *)parent + 0x1c8))(parent,this_00);
  iVar1 = (**(code **)(*(long *)parent + 0x1d0))(parent,this->model->m_sel_model);
  return iVar1;
}

Assistant:

void QUndoViewPrivate::init()
{
    Q_Q(QUndoView);

    model = new QUndoModel(q);
    q->setModel(model);
    q->setSelectionModel(model->selectionModel());
}